

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__build_huffman(stbi__huffman *h,int *count)

{
  undefined1 auVar1 [64];
  ushort uVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  undefined1 auVar9 [64];
  undefined1 in_ZMM0 [64];
  
  lVar4 = 0;
  iVar5 = 0;
  do {
    if (0 < count[lVar4]) {
      lVar8 = 0;
      do {
        h->size[lVar8 + iVar5] = (char)lVar4 + '\x01';
        lVar8 = lVar8 + 1;
      } while ((int)lVar8 < count[lVar4]);
      iVar5 = iVar5 + (int)lVar8;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  h->size[iVar5] = '\0';
  iVar5 = 0;
  uVar3 = 1;
  uVar6 = 0;
  do {
    h->delta[uVar3] = uVar6 - iVar5;
    lVar4 = (long)(int)uVar6;
    if (uVar3 == h->size[lVar4]) {
      if (uVar3 == h->size[lVar4]) {
        do {
          h->code[lVar4] = (stbi__uint16)iVar5;
          iVar5 = iVar5 + 1;
          lVar8 = lVar4 + 1;
          lVar4 = lVar4 + 1;
        } while (uVar3 == h->size[lVar8]);
        uVar6 = (uint)lVar4;
      }
      if (iVar5 - 1U >> ((uint)uVar3 & 0x1f) != 0) {
        stbi__g_failure_reason = "bad code lengths";
        return 0;
      }
    }
    h->maxcode[uVar3] = iVar5 << ((byte)(0x10 - (char)uVar3) & 0x1f);
    iVar5 = iVar5 * 2;
    uVar3 = uVar3 + 1;
    if (uVar3 == 0x11) {
      h->maxcode[0x11] = 0xffffffff;
      auVar9 = vpternlogd_avx512f(in_ZMM0,in_ZMM0,in_ZMM0,0xff);
      auVar1 = vmovdqu64_avx512f(auVar9);
      *(undefined1 (*) [64])h->fast = auVar1;
      auVar1 = vmovdqu64_avx512f(auVar9);
      *(undefined1 (*) [64])(h->fast + 0x40) = auVar1;
      auVar1 = vmovdqu64_avx512f(auVar9);
      *(undefined1 (*) [64])(h->fast + 0x80) = auVar1;
      auVar1 = vmovdqu64_avx512f(auVar9);
      *(undefined1 (*) [64])(h->fast + 0xc0) = auVar1;
      auVar1 = vmovdqu64_avx512f(auVar9);
      *(undefined1 (*) [64])(h->fast + 0x100) = auVar1;
      auVar1 = vmovdqu64_avx512f(auVar9);
      *(undefined1 (*) [64])(h->fast + 0x140) = auVar1;
      auVar1 = vmovdqu64_avx512f(auVar9);
      *(undefined1 (*) [64])(h->fast + 0x180) = auVar1;
      auVar1 = vmovdqu64_avx512f(auVar9);
      *(undefined1 (*) [64])(h->fast + 0x1c0) = auVar1;
      if (0 < (int)uVar6) {
        uVar3 = 0;
        do {
          if ((ulong)h->size[uVar3] < 10) {
            uVar2 = h->code[uVar3];
            uVar7 = 9 - (ulong)h->size[uVar3];
            lVar4 = 0;
            do {
              h->fast[lVar4 + ((ulong)uVar2 << (uVar7 & 0x3f))] = (stbi_uc)uVar3;
              lVar4 = lVar4 + 1;
            } while ((uint)lVar4 >> ((uint)uVar7 & 0x1f) == 0);
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 != uVar6);
      }
      return 1;
    }
  } while( true );
}

Assistant:

static int stbi__build_huffman(stbi__huffman *h, int *count)
{
   int i,j,k=0;
   unsigned int code;
   // build size list for each symbol (from JPEG spec)
   for (i=0; i < 16; ++i)
      for (j=0; j < count[i]; ++j)
         h->size[k++] = (stbi_uc) (i+1);
   h->size[k] = 0;

   // compute actual symbols (from jpeg spec)
   code = 0;
   k = 0;
   for(j=1; j <= 16; ++j) {
      // compute delta to add to code to compute symbol id
      h->delta[j] = k - code;
      if (h->size[k] == j) {
         while (h->size[k] == j)
            h->code[k++] = (stbi__uint16) (code++);
         if (code-1 >= (1u << j)) return stbi__err("bad code lengths","Corrupt JPEG");
      }
      // compute largest code + 1 for this size, preshifted as needed later
      h->maxcode[j] = code << (16-j);
      code <<= 1;
   }
   h->maxcode[j] = 0xffffffff;

   // build non-spec acceleration table; 255 is flag for not-accelerated
   memset(h->fast, 255, 1 << FAST_BITS);
   for (i=0; i < k; ++i) {
      int s = h->size[i];
      if (s <= FAST_BITS) {
         int c = h->code[i] << (FAST_BITS-s);
         int m = 1 << (FAST_BITS-s);
         for (j=0; j < m; ++j) {
            h->fast[c+j] = (stbi_uc) i;
         }
      }
   }
   return 1;
}